

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_boundary.cpp
# Opt level: O2

void test_word_container<wchar_t,__gnu_cxx::__normal_iterator<wchar_t*,std::__cxx11::wstring>>
               (__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
                begin,__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
                      end,vector<int,_std::allocator<int>_> *ipos,
               vector<int,_std::allocator<int>_> *imasks,
               vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
               *ichunks,locale *l,boundary_type bt)

{
  int iVar1;
  pointer piVar2;
  element_type *peVar3;
  pointer pbVar4;
  pointer pbVar5;
  __type _Var6;
  bool bVar7;
  ostream *poVar8;
  ulong uVar9;
  reference pvVar10;
  runtime_error *prVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  ulong uVar15;
  uint uVar16;
  __normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
  _Var17;
  allocator local_259;
  bi_type bi_2;
  boundary_point_index<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
  map_1;
  ti_type ti_2;
  segment_index<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
  map;
  __normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
  begin_local;
  vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
  chunks;
  ti_type ti_3;
  vector<int,_std::allocator<int>_> masks;
  vector<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>_>
  iters;
  vector<unsigned_int,_std::allocator<unsigned_int>_> bmasks;
  vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
  fchunks;
  vector<int,_std::allocator<int>_> pos;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> empty_chunk;
  
  uVar12 = 3;
  if (bt == word) {
    uVar12 = 0x1f;
  }
  begin_local._M_current = begin._M_current;
  do {
    if ((int)uVar12 < 0) {
      return;
    }
    uVar13 = 0;
    if ((uVar12 & 1) != 0) {
      uVar13 = 0xf;
    }
    masks.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    masks.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
         (pointer)0x0;
    masks.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
         (pointer)0x0;
    pos.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    pos.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
         (pointer)0x0;
    pos.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
         (pointer)0x0;
    bmasks.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    empty_chunk._M_dataplus._M_p = (pointer)&empty_chunk.field_2;
    empty_chunk._M_string_length = 0;
    bmasks.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    bmasks.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    empty_chunk.field_2._M_local_buf[0] = L'\0';
    chunks.
    super__Vector_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    chunks.
    super__Vector_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    chunks.
    super__Vector_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    fchunks.
    super__Vector_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    fchunks.
    super__Vector_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    fchunks.
    super__Vector_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    iters.
    super__Vector_base<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    iters.
    super__Vector_base<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    iters.
    super__Vector_base<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::
    vector<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>_>
    ::push_back(&iters,&begin_local);
    map_1.map_.index_.
    super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = (element_type *)
              ((ulong)map_1.map_.index_.
                      super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr & 0xffffffff00000000);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
              (&bmasks,(uint *)&map_1);
    uVar13 = (int)(uVar12 << 0x1b) >> 0x1f & 0xf0000U |
             (int)(uVar12 << 0x1c) >> 0x1f & 0xf000U |
             (int)(uVar12 << 0x1d) >> 0x1f & 0xf00U | (int)(uVar12 << 0x1e) >> 0x1f & 0xf0U | uVar13
    ;
    uVar14 = 0;
    while( true ) {
      uVar15 = (ulong)uVar14;
      piVar2 = (imasks->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_start;
      if ((ulong)((long)(imasks->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                        super__Vector_impl_data._M_finish - (long)piVar2 >> 2) <= uVar15) break;
      if ((piVar2[uVar15] & uVar13) == 0) {
        std::__cxx11::wstring::append((wstring *)&empty_chunk);
      }
      else {
        std::vector<int,_std::allocator<int>_>::push_back(&masks,piVar2 + uVar15);
        std::
        vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
        ::push_back(&chunks,(ichunks->
                            super__Vector_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_start + uVar15);
        std::operator+((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *
                       )&map_1,&empty_chunk,
                       (ichunks->
                       super__Vector_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_start + uVar15);
        std::vector<std::__cxx11::wstring,std::allocator<std::__cxx11::wstring>>::
        emplace_back<std::__cxx11::wstring>
                  ((vector<std::__cxx11::wstring,std::allocator<std::__cxx11::wstring>> *)&fchunks,
                   (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)
                   &map_1);
        std::__cxx11::wstring::~wstring((wstring *)&map_1);
        empty_chunk._M_string_length = 0;
        *empty_chunk._M_dataplus._M_p = L'\0';
        std::vector<int,_std::allocator<int>_>::push_back
                  (&pos,(ipos->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                        super__Vector_impl_data._M_start + uVar15);
      }
      piVar2 = (imasks->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_start;
      if (((piVar2[uVar15] & uVar13) != 0) ||
         (((long)(imasks->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                 super__Vector_impl_data._M_finish - (long)piVar2 >> 2) - 1U == uVar15)) {
        map_1.map_.index_.
        super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
        ._M_ptr = (element_type *)
                  (begin_local._M_current +
                  (ipos->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                  super__Vector_impl_data._M_start[uVar15]);
        std::
        vector<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>_>
        ::push_back(&iters,(value_type *)&map_1);
        bi_2.map_.index_.
        super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
        ._M_ptr = (element_type *)
                  CONCAT44(bi_2.map_.index_.
                           super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
                           ._M_ptr._4_4_,
                           (imasks->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                           super__Vector_impl_data._M_start[uVar15]);
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
                  (&bmasks,(uint *)&bi_2);
      }
      uVar14 = uVar14 + 1;
    }
    booster::locale::boundary::
    segment_index<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
    ::segment_index(&map,bt,(base_iterator)begin_local._M_current,(base_iterator)end._M_current,l);
    map_1.map_.index_.
    super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = (element_type *)0x0;
    map_1.map_.index_.
    super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    map_1.map_.end_._M_current = (wchar_t *)0x0;
    map_1.mask_ = 0;
    map_1._36_4_ = 0;
    map.full_select_ = false;
    map.mask_ = uVar13;
    booster::locale::boundary::
    segment_index<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
    ::begin((iterator *)&bi_2,&map);
    map_1.map_.index_.
    super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = bi_2.map_.index_.
              super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr;
    map_1.map_.index_.
    super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount = bi_2.map_.index_.
                   super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount;
    map_1.map_.begin_._M_current._0_4_ = (int)bi_2.map_.begin_._M_current;
    map_1._36_4_ = bi_2._36_4_;
    map_1.mask_ = bi_2.mask_;
    map_1.map_.end_ = bi_2.map_.end_;
    uVar15 = 0;
    uVar14 = 0xffffffff;
    while( true ) {
      booster::locale::boundary::
      segment_index<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
      ::end((iterator *)&bi_2,&map);
      test_counter = test_counter + 1;
      if (map_1._32_8_ == CONCAT44(bi_2._36_4_,bi_2.mask_)) break;
      booster::locale::boundary::
      segment<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
      ::str((string_type *)&bi_2,
            (segment<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
             *)&map_1);
      _Var6 = std::operator==((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
                               *)&bi_2,chunks.
                                       super__Vector_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start + uVar15);
      std::__cxx11::wstring::~wstring((wstring *)&bi_2);
      if (!_Var6) {
        poVar8 = std::operator<<((ostream *)&std::cerr,"Error in line:");
        poVar8 = (ostream *)std::ostream::operator<<((ostream *)poVar8,0x67);
        poVar8 = std::operator<<(poVar8," p->str()==chunks[i]");
        std::endl<char,std::char_traits<char>>(poVar8);
        iVar1 = error_counter + 1;
        bVar7 = 100000 < error_counter;
        error_counter = iVar1;
        if (bVar7) {
          prVar11 = (runtime_error *)__cxa_allocate_exception(0x30);
          std::__cxx11::string::string
                    ((string *)&bi_2,"Error limits reached, stopping unit test",(allocator *)&ti_2);
          booster::runtime_error::runtime_error(prVar11,(string *)&bi_2);
          __cxa_throw(prVar11,&booster::runtime_error::typeinfo,
                      booster::runtime_error::~runtime_error);
        }
      }
      test_counter = test_counter + 1;
      if ((int)map_1.map_.begin_._M_current !=
          masks.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start[uVar15]) {
        poVar8 = std::operator<<((ostream *)&std::cerr,"Error in line:");
        poVar8 = (ostream *)std::ostream::operator<<((ostream *)poVar8,0x68);
        poVar8 = std::operator<<(poVar8," p->rule() == unsigned(masks[i])");
        std::endl<char,std::char_traits<char>>(poVar8);
        iVar1 = error_counter + 1;
        bVar7 = 100000 < error_counter;
        error_counter = iVar1;
        if (bVar7) {
          prVar11 = (runtime_error *)__cxa_allocate_exception(0x30);
          std::__cxx11::string::string
                    ((string *)&bi_2,"Error limits reached, stopping unit test",(allocator *)&ti_2);
          booster::runtime_error::runtime_error(prVar11,(string *)&bi_2);
          __cxa_throw(prVar11,&booster::runtime_error::typeinfo,
                      booster::runtime_error::~runtime_error);
        }
      }
      booster::locale::boundary::details::
      segment_index_iterator<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
      ::increment((segment_index_iterator<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                   *)&map_1);
      uVar15 = (ulong)((int)uVar15 + 1);
      uVar14 = uVar14 + 1;
    }
    if ((long)chunks.
              super__Vector_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish -
        (long)chunks.
              super__Vector_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start >> 5 != uVar15) {
      poVar8 = std::operator<<((ostream *)&std::cerr,"Error in line:");
      poVar8 = (ostream *)std::ostream::operator<<((ostream *)poVar8,0x6b);
      poVar8 = std::operator<<(poVar8," chunks.size() == i");
      std::endl<char,std::char_traits<char>>(poVar8);
      iVar1 = error_counter + 1;
      bVar7 = 100000 < error_counter;
      error_counter = iVar1;
      if (bVar7) {
        prVar11 = (runtime_error *)__cxa_allocate_exception(0x30);
        std::__cxx11::string::string
                  ((string *)&bi_2,"Error limits reached, stopping unit test",(allocator *)&ti_2);
        booster::runtime_error::runtime_error(prVar11,(string *)&bi_2);
        __cxa_throw(prVar11,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error
                   );
      }
    }
    while (booster::locale::boundary::
           segment_index<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
           ::begin((iterator *)&bi_2,&map), map_1._32_8_ != CONCAT44(bi_2._36_4_,bi_2.mask_)) {
      booster::locale::boundary::details::
      segment_index_iterator<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
      ::decrement((segment_index_iterator<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                   *)&map_1);
      test_counter = test_counter + 1;
      booster::locale::boundary::
      segment<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
      ::str((string_type *)&bi_2,
            (segment<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
             *)&map_1);
      _Var6 = std::operator==((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
                               *)&bi_2,chunks.
                                       super__Vector_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start + uVar14);
      std::__cxx11::wstring::~wstring((wstring *)&bi_2);
      if (!_Var6) {
        poVar8 = std::operator<<((ostream *)&std::cerr,"Error in line:");
        poVar8 = (ostream *)std::ostream::operator<<((ostream *)poVar8,0x73);
        poVar8 = std::operator<<(poVar8," p->str()==chunks[--i]");
        std::endl<char,std::char_traits<char>>(poVar8);
        iVar1 = error_counter + 1;
        bVar7 = 100000 < error_counter;
        error_counter = iVar1;
        if (bVar7) {
          prVar11 = (runtime_error *)__cxa_allocate_exception(0x30);
          std::__cxx11::string::string
                    ((string *)&bi_2,"Error limits reached, stopping unit test",(allocator *)&ti_2);
          booster::runtime_error::runtime_error(prVar11,(string *)&bi_2);
          __cxa_throw(prVar11,&booster::runtime_error::typeinfo,
                      booster::runtime_error::~runtime_error);
        }
      }
      test_counter = test_counter + 1;
      if ((int)map_1.map_.begin_._M_current !=
          masks.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start[uVar14]) {
        poVar8 = std::operator<<((ostream *)&std::cerr,"Error in line:");
        poVar8 = (ostream *)std::ostream::operator<<((ostream *)poVar8,0x74);
        poVar8 = std::operator<<(poVar8," p->rule() == unsigned(masks[i])");
        std::endl<char,std::char_traits<char>>(poVar8);
        iVar1 = error_counter + 1;
        bVar7 = 100000 < error_counter;
        error_counter = iVar1;
        if (bVar7) {
          prVar11 = (runtime_error *)__cxa_allocate_exception(0x30);
          std::__cxx11::string::string
                    ((string *)&bi_2,"Error limits reached, stopping unit test",(allocator *)&ti_2);
          booster::runtime_error::runtime_error(prVar11,(string *)&bi_2);
          __cxa_throw(prVar11,&booster::runtime_error::typeinfo,
                      booster::runtime_error::~runtime_error);
        }
      }
      uVar14 = uVar14 - 1;
    }
    test_counter = test_counter + 1;
    if (uVar14 != 0xffffffff) {
      poVar8 = std::operator<<((ostream *)&std::cerr,"Error in line:");
      poVar8 = (ostream *)std::ostream::operator<<((ostream *)poVar8,0x6e);
      poVar8 = std::operator<<(poVar8," i==0");
      std::endl<char,std::char_traits<char>>(poVar8);
      iVar1 = error_counter + 1;
      bVar7 = 100000 < error_counter;
      error_counter = iVar1;
      if (bVar7) {
        prVar11 = (runtime_error *)__cxa_allocate_exception(0x30);
        std::__cxx11::string::string
                  ((string *)&bi_2,"Error limits reached, stopping unit test",(allocator *)&ti_2);
        booster::runtime_error::runtime_error(prVar11,(string *)&bi_2);
        __cxa_throw(prVar11,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error
                   );
      }
    }
    booster::locale::boundary::
    segment_index<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
    ::end((iterator *)&bi_2,&map);
    map_1.map_.index_.
    super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = bi_2.map_.index_.
              super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr;
    map_1.map_.index_.
    super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount = bi_2.map_.index_.
                   super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount;
    map_1.map_.begin_._M_current._0_4_ = (int)bi_2.map_.begin_._M_current;
    map_1._36_4_ = bi_2._36_4_;
    map_1.mask_ = bi_2.mask_;
    map_1.map_.end_ = bi_2.map_.end_;
    for (uVar14 = 0;
        (ulong)uVar14 <
        (ulong)((long)chunks.
                      super__Vector_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)chunks.
                      super__Vector_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 5); uVar14 = uVar14 + 1) {
      booster::locale::boundary::details::
      segment_index_iterator<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
      ::decrement((segment_index_iterator<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                   *)&map_1);
      pbVar5 = chunks.
               super__Vector_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      pbVar4 = chunks.
               super__Vector_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      test_counter = test_counter + 1;
      booster::locale::boundary::
      segment<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
      ::str((string_type *)&bi_2,
            (segment<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
             *)&map_1);
      uVar16 = (int)((ulong)((long)pbVar5 - (long)pbVar4) >> 5) + ~uVar14;
      _Var6 = std::operator==((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
                               *)&bi_2,chunks.
                                       super__Vector_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start + uVar16);
      std::__cxx11::wstring::~wstring((wstring *)&bi_2);
      if (!_Var6) {
        poVar8 = std::operator<<((ostream *)&std::cerr,"Error in line:");
        poVar8 = (ostream *)std::ostream::operator<<((ostream *)poVar8,0x7a);
        poVar8 = std::operator<<(poVar8," p->str()==chunks[index]");
        std::endl<char,std::char_traits<char>>(poVar8);
        iVar1 = error_counter + 1;
        bVar7 = 100000 < error_counter;
        error_counter = iVar1;
        if (bVar7) {
          prVar11 = (runtime_error *)__cxa_allocate_exception(0x30);
          std::__cxx11::string::string
                    ((string *)&bi_2,"Error limits reached, stopping unit test",(allocator *)&ti_2);
          booster::runtime_error::runtime_error(prVar11,(string *)&bi_2);
          __cxa_throw(prVar11,&booster::runtime_error::typeinfo,
                      booster::runtime_error::~runtime_error);
        }
      }
      test_counter = test_counter + 1;
      if ((int)map_1.map_.begin_._M_current !=
          masks.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start[uVar16]) {
        poVar8 = std::operator<<((ostream *)&std::cerr,"Error in line:");
        poVar8 = (ostream *)std::ostream::operator<<((ostream *)poVar8,0x7b);
        poVar8 = std::operator<<(poVar8," p->rule() == unsigned(masks[index])");
        std::endl<char,std::char_traits<char>>(poVar8);
        iVar1 = error_counter + 1;
        bVar7 = 100000 < error_counter;
        error_counter = iVar1;
        if (bVar7) {
          prVar11 = (runtime_error *)__cxa_allocate_exception(0x30);
          std::__cxx11::string::string
                    ((string *)&bi_2,"Error limits reached, stopping unit test",(allocator *)&ti_2);
          booster::runtime_error::runtime_error(prVar11,(string *)&bi_2);
          __cxa_throw(prVar11,&booster::runtime_error::typeinfo,
                      booster::runtime_error::~runtime_error);
        }
      }
    }
    test_counter = test_counter + 1;
    booster::locale::boundary::
    segment_index<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
    ::begin((iterator *)&bi_2,&map);
    if (map_1._32_8_ != CONCAT44(bi_2._36_4_,bi_2.mask_)) {
      poVar8 = std::operator<<((ostream *)&std::cerr,"Error in line:");
      poVar8 = (ostream *)std::ostream::operator<<((ostream *)poVar8,0x7d);
      poVar8 = std::operator<<(poVar8," p==map.begin()");
      std::endl<char,std::char_traits<char>>(poVar8);
      iVar1 = error_counter + 1;
      bVar7 = 100000 < error_counter;
      error_counter = iVar1;
      if (bVar7) {
        prVar11 = (runtime_error *)__cxa_allocate_exception(0x30);
        std::__cxx11::string::string
                  ((string *)&bi_2,"Error limits reached, stopping unit test",(allocator *)&ti_2);
        booster::runtime_error::runtime_error(prVar11,(string *)&bi_2);
        __cxa_throw(prVar11,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error
                   );
      }
    }
    map_1.map_.index_.
    super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = (element_type *)0x0;
    map_1.map_.index_.
    super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    map_1.map_.end_._M_current = (wchar_t *)0x0;
    map_1.mask_ = 0;
    map_1._36_4_ = 0;
    map.full_select_ = true;
    booster::locale::boundary::
    segment_index<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
    ::begin((iterator *)&bi_2,&map);
    map_1.map_.index_.
    super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = bi_2.map_.index_.
              super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr;
    map_1.map_.index_.
    super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount = bi_2.map_.index_.
                   super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount;
    map_1.map_.begin_._M_current._0_4_ = (int)bi_2.map_.begin_._M_current;
    map_1._36_4_ = bi_2._36_4_;
    map_1.mask_ = bi_2.mask_;
    map_1.map_.end_ = bi_2.map_.end_;
    uVar15 = 0;
    uVar14 = 0xffffffff;
    while( true ) {
      booster::locale::boundary::
      segment_index<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
      ::end((iterator *)&bi_2,&map);
      test_counter = test_counter + 1;
      if (map_1._32_8_ == CONCAT44(bi_2._36_4_,bi_2.mask_)) break;
      booster::locale::boundary::
      segment<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
      ::str((string_type *)&bi_2,
            (segment<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
             *)&map_1);
      _Var6 = std::operator==((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
                               *)&bi_2,fchunks.
                                       super__Vector_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start + uVar15);
      std::__cxx11::wstring::~wstring((wstring *)&bi_2);
      if (!_Var6) {
        poVar8 = std::operator<<((ostream *)&std::cerr,"Error in line:");
        poVar8 = (ostream *)std::ostream::operator<<((ostream *)poVar8,0x85);
        poVar8 = std::operator<<(poVar8," p->str()==fchunks[i]");
        std::endl<char,std::char_traits<char>>(poVar8);
        iVar1 = error_counter + 1;
        bVar7 = 100000 < error_counter;
        error_counter = iVar1;
        if (bVar7) {
          prVar11 = (runtime_error *)__cxa_allocate_exception(0x30);
          std::__cxx11::string::string
                    ((string *)&bi_2,"Error limits reached, stopping unit test",(allocator *)&ti_2);
          booster::runtime_error::runtime_error(prVar11,(string *)&bi_2);
          __cxa_throw(prVar11,&booster::runtime_error::typeinfo,
                      booster::runtime_error::~runtime_error);
        }
      }
      test_counter = test_counter + 1;
      if ((int)map_1.map_.begin_._M_current !=
          masks.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start[uVar15]) {
        poVar8 = std::operator<<((ostream *)&std::cerr,"Error in line:");
        poVar8 = (ostream *)std::ostream::operator<<((ostream *)poVar8,0x86);
        poVar8 = std::operator<<(poVar8," p->rule() == unsigned(masks[i])");
        std::endl<char,std::char_traits<char>>(poVar8);
        iVar1 = error_counter + 1;
        bVar7 = 100000 < error_counter;
        error_counter = iVar1;
        if (bVar7) {
          prVar11 = (runtime_error *)__cxa_allocate_exception(0x30);
          std::__cxx11::string::string
                    ((string *)&bi_2,"Error limits reached, stopping unit test",(allocator *)&ti_2);
          booster::runtime_error::runtime_error(prVar11,(string *)&bi_2);
          __cxa_throw(prVar11,&booster::runtime_error::typeinfo,
                      booster::runtime_error::~runtime_error);
        }
      }
      booster::locale::boundary::details::
      segment_index_iterator<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
      ::increment((segment_index_iterator<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                   *)&map_1);
      uVar15 = (ulong)((int)uVar15 + 1);
      uVar14 = uVar14 + 1;
    }
    if ((long)chunks.
              super__Vector_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish -
        (long)chunks.
              super__Vector_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start >> 5 != uVar15) {
      poVar8 = std::operator<<((ostream *)&std::cerr,"Error in line:");
      poVar8 = (ostream *)std::ostream::operator<<((ostream *)poVar8,0x89);
      poVar8 = std::operator<<(poVar8," chunks.size() == i");
      std::endl<char,std::char_traits<char>>(poVar8);
      iVar1 = error_counter + 1;
      bVar7 = 100000 < error_counter;
      error_counter = iVar1;
      if (bVar7) {
        prVar11 = (runtime_error *)__cxa_allocate_exception(0x30);
        std::__cxx11::string::string
                  ((string *)&bi_2,"Error limits reached, stopping unit test",(allocator *)&ti_2);
        booster::runtime_error::runtime_error(prVar11,(string *)&bi_2);
        __cxa_throw(prVar11,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error
                   );
      }
    }
    while (booster::locale::boundary::
           segment_index<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
           ::begin((iterator *)&bi_2,&map), map_1._32_8_ != CONCAT44(bi_2._36_4_,bi_2.mask_)) {
      booster::locale::boundary::details::
      segment_index_iterator<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
      ::decrement((segment_index_iterator<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                   *)&map_1);
      booster::locale::boundary::
      segment<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
      ::str((string_type *)&bi_2,
            (segment<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
             *)&map_1);
      bVar7 = std::operator!=((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
                               *)&bi_2,fchunks.
                                       super__Vector_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start + uVar14);
      std::__cxx11::wstring::~wstring((wstring *)&bi_2);
      if (bVar7) {
        booster::locale::boundary::
        segment<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
        ::str((string_type *)&bi_2,
              (segment<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
               *)&map_1);
        std::__cxx11::wstring::~wstring((wstring *)&bi_2);
      }
      test_counter = test_counter + 1;
      booster::locale::boundary::
      segment<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
      ::str((string_type *)&bi_2,
            (segment<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
             *)&map_1);
      _Var6 = std::operator==((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
                               *)&bi_2,fchunks.
                                       super__Vector_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start + uVar14);
      std::__cxx11::wstring::~wstring((wstring *)&bi_2);
      if (!_Var6) {
        poVar8 = std::operator<<((ostream *)&std::cerr,"Error in line:");
        poVar8 = (ostream *)std::ostream::operator<<((ostream *)poVar8,0x96);
        poVar8 = std::operator<<(poVar8," p->str()==fchunks[--i]");
        std::endl<char,std::char_traits<char>>(poVar8);
        iVar1 = error_counter + 1;
        bVar7 = 100000 < error_counter;
        error_counter = iVar1;
        if (bVar7) {
          prVar11 = (runtime_error *)__cxa_allocate_exception(0x30);
          std::__cxx11::string::string
                    ((string *)&bi_2,"Error limits reached, stopping unit test",(allocator *)&ti_2);
          booster::runtime_error::runtime_error(prVar11,(string *)&bi_2);
          __cxa_throw(prVar11,&booster::runtime_error::typeinfo,
                      booster::runtime_error::~runtime_error);
        }
      }
      test_counter = test_counter + 1;
      if ((int)map_1.map_.begin_._M_current !=
          masks.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start[uVar14]) {
        poVar8 = std::operator<<((ostream *)&std::cerr,"Error in line:");
        poVar8 = (ostream *)std::ostream::operator<<((ostream *)poVar8,0x97);
        poVar8 = std::operator<<(poVar8," p->rule() == unsigned(masks[i])");
        std::endl<char,std::char_traits<char>>(poVar8);
        iVar1 = error_counter + 1;
        bVar7 = 100000 < error_counter;
        error_counter = iVar1;
        if (bVar7) {
          prVar11 = (runtime_error *)__cxa_allocate_exception(0x30);
          std::__cxx11::string::string
                    ((string *)&bi_2,"Error limits reached, stopping unit test",(allocator *)&ti_2);
          booster::runtime_error::runtime_error(prVar11,(string *)&bi_2);
          __cxa_throw(prVar11,&booster::runtime_error::typeinfo,
                      booster::runtime_error::~runtime_error);
        }
      }
      uVar14 = uVar14 - 1;
    }
    test_counter = test_counter + 1;
    if (uVar14 != 0xffffffff) {
      poVar8 = std::operator<<((ostream *)&std::cerr,"Error in line:");
      poVar8 = (ostream *)std::ostream::operator<<((ostream *)poVar8,0x8d);
      poVar8 = std::operator<<(poVar8," i==0");
      std::endl<char,std::char_traits<char>>(poVar8);
      iVar1 = error_counter + 1;
      bVar7 = 100000 < error_counter;
      error_counter = iVar1;
      if (bVar7) {
        prVar11 = (runtime_error *)__cxa_allocate_exception(0x30);
        std::__cxx11::string::string
                  ((string *)&bi_2,"Error limits reached, stopping unit test",(allocator *)&ti_2);
        booster::runtime_error::runtime_error(prVar11,(string *)&bi_2);
        __cxa_throw(prVar11,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error
                   );
      }
    }
    booster::locale::boundary::
    segment_index<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
    ::end((iterator *)&bi_2,&map);
    map_1.map_.index_.
    super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = bi_2.map_.index_.
              super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr;
    map_1.map_.index_.
    super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount = bi_2.map_.index_.
                   super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount;
    map_1.map_.begin_._M_current._0_4_ = (int)bi_2.map_.begin_._M_current;
    map_1._36_4_ = bi_2._36_4_;
    map_1.mask_ = bi_2.mask_;
    map_1.map_.end_ = bi_2.map_.end_;
    for (uVar14 = 0;
        (ulong)uVar14 <
        (ulong)((long)chunks.
                      super__Vector_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)chunks.
                      super__Vector_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 5); uVar14 = uVar14 + 1) {
      booster::locale::boundary::details::
      segment_index_iterator<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
      ::decrement((segment_index_iterator<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                   *)&map_1);
      pbVar5 = chunks.
               super__Vector_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      pbVar4 = chunks.
               super__Vector_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      test_counter = test_counter + 1;
      booster::locale::boundary::
      segment<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
      ::str((string_type *)&bi_2,
            (segment<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
             *)&map_1);
      uVar16 = (int)((ulong)((long)pbVar5 - (long)pbVar4) >> 5) + ~uVar14;
      _Var6 = std::operator==((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
                               *)&bi_2,fchunks.
                                       super__Vector_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start + uVar16);
      std::__cxx11::wstring::~wstring((wstring *)&bi_2);
      if (!_Var6) {
        poVar8 = std::operator<<((ostream *)&std::cerr,"Error in line:");
        poVar8 = (ostream *)std::ostream::operator<<((ostream *)poVar8,0x9e);
        poVar8 = std::operator<<(poVar8," p->str()==fchunks[index]");
        std::endl<char,std::char_traits<char>>(poVar8);
        iVar1 = error_counter + 1;
        bVar7 = 100000 < error_counter;
        error_counter = iVar1;
        if (bVar7) {
          prVar11 = (runtime_error *)__cxa_allocate_exception(0x30);
          std::__cxx11::string::string
                    ((string *)&bi_2,"Error limits reached, stopping unit test",(allocator *)&ti_2);
          booster::runtime_error::runtime_error(prVar11,(string *)&bi_2);
          __cxa_throw(prVar11,&booster::runtime_error::typeinfo,
                      booster::runtime_error::~runtime_error);
        }
      }
      test_counter = test_counter + 1;
      if ((int)map_1.map_.begin_._M_current !=
          masks.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start[uVar16]) {
        poVar8 = std::operator<<((ostream *)&std::cerr,"Error in line:");
        poVar8 = (ostream *)std::ostream::operator<<((ostream *)poVar8,0x9f);
        poVar8 = std::operator<<(poVar8," p->rule() == unsigned(masks[index])");
        std::endl<char,std::char_traits<char>>(poVar8);
        iVar1 = error_counter + 1;
        bVar7 = 100000 < error_counter;
        error_counter = iVar1;
        if (bVar7) {
          prVar11 = (runtime_error *)__cxa_allocate_exception(0x30);
          std::__cxx11::string::string
                    ((string *)&bi_2,"Error limits reached, stopping unit test",(allocator *)&ti_2);
          booster::runtime_error::runtime_error(prVar11,(string *)&bi_2);
          __cxa_throw(prVar11,&booster::runtime_error::typeinfo,
                      booster::runtime_error::~runtime_error);
        }
      }
    }
    test_counter = test_counter + 1;
    booster::locale::boundary::
    segment_index<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
    ::begin((iterator *)&bi_2,&map);
    if (map_1._32_8_ != CONCAT44(bi_2._36_4_,bi_2.mask_)) {
      poVar8 = std::operator<<((ostream *)&std::cerr,"Error in line:");
      poVar8 = (ostream *)std::ostream::operator<<((ostream *)poVar8,0xa1);
      poVar8 = std::operator<<(poVar8," p==map.begin()");
      std::endl<char,std::char_traits<char>>(poVar8);
      iVar1 = error_counter + 1;
      bVar7 = 100000 < error_counter;
      error_counter = iVar1;
      if (bVar7) {
        prVar11 = (runtime_error *)__cxa_allocate_exception(0x30);
        std::__cxx11::string::string
                  ((string *)&bi_2,"Error limits reached, stopping unit test",(allocator *)&ti_2);
        booster::runtime_error::runtime_error(prVar11,(string *)&bi_2);
        __cxa_throw(prVar11,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error
                   );
      }
    }
    map_1.map_.index_.
    super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = (element_type *)0x0;
    map_1.map_.index_.
    super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    map_1.map_.end_._M_current = (wchar_t *)0x0;
    map_1.mask_ = 0;
    map_1._36_4_ = 0;
    map.full_select_ = false;
    uVar15 = 0;
    uVar14 = 0;
    for (_Var17._M_current = begin_local._M_current; _Var17._M_current != end._M_current;
        _Var17._M_current = _Var17._M_current + 1) {
      booster::locale::boundary::
      segment_index<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
      ::find((iterator *)&bi_2,&map,(base_iterator)_Var17._M_current);
      map_1.map_.index_.
      super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr = bi_2.map_.index_.
                super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr;
      map_1.map_.index_.
      super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount = bi_2.map_.index_.
                     super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount;
      map_1.map_.begin_._M_current._0_4_ = (int)bi_2.map_.begin_._M_current;
      map_1._36_4_ = bi_2._36_4_;
      map_1.mask_ = bi_2.mask_;
      map_1.map_.end_ = bi_2.map_.end_;
      uVar9 = (long)pos.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)pos.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start >> 2;
      if (uVar15 < uVar9) {
        uVar15 = (ulong)(((int)uVar15 + 1) -
                        (uint)(uVar14 < (uint)pos.super__Vector_base<int,_std::allocator<int>_>.
                                              _M_impl.super__Vector_impl_data._M_start[uVar15]));
      }
      test_counter = test_counter + 1;
      if (uVar15 < uVar9) {
        booster::locale::boundary::
        segment<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
        ::str((string_type *)&bi_2,
              (segment<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
               *)&map_1);
        _Var6 = std::operator==((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
                                 *)&bi_2,chunks.
                                         super__Vector_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start + uVar15);
        std::__cxx11::wstring::~wstring((wstring *)&bi_2);
        if (!_Var6) {
          poVar8 = std::operator<<((ostream *)&std::cerr,"Error in line:");
          poVar8 = (ostream *)std::ostream::operator<<((ostream *)poVar8,0xb2);
          poVar8 = std::operator<<(poVar8," p->str()==chunks[chunk_ptr]");
          std::endl<char,std::char_traits<char>>(poVar8);
          iVar1 = error_counter + 1;
          bVar7 = 100000 < error_counter;
          error_counter = iVar1;
          if (bVar7) {
            prVar11 = (runtime_error *)__cxa_allocate_exception(0x30);
            std::__cxx11::string::string
                      ((string *)&bi_2,"Error limits reached, stopping unit test",(allocator *)&ti_2
                      );
            booster::runtime_error::runtime_error(prVar11,(string *)&bi_2);
            __cxa_throw(prVar11,&booster::runtime_error::typeinfo,
                        booster::runtime_error::~runtime_error);
          }
        }
        test_counter = test_counter + 1;
        if ((int)map_1.map_.begin_._M_current !=
            masks.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start[uVar15]) {
          poVar8 = std::operator<<((ostream *)&std::cerr,"Error in line:");
          poVar8 = (ostream *)std::ostream::operator<<((ostream *)poVar8,0xb3);
          poVar8 = std::operator<<(poVar8," p->rule()==unsigned(masks[chunk_ptr])");
          std::endl<char,std::char_traits<char>>(poVar8);
          iVar1 = error_counter + 1;
          bVar7 = 100000 < error_counter;
          error_counter = iVar1;
          if (bVar7) {
            prVar11 = (runtime_error *)__cxa_allocate_exception(0x30);
            std::__cxx11::string::string
                      ((string *)&bi_2,"Error limits reached, stopping unit test",(allocator *)&ti_2
                      );
            booster::runtime_error::runtime_error(prVar11,(string *)&bi_2);
            __cxa_throw(prVar11,&booster::runtime_error::typeinfo,
                        booster::runtime_error::~runtime_error);
          }
        }
      }
      else {
        booster::locale::boundary::
        segment_index<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
        ::end((iterator *)&bi_2,&map);
        if (map_1._32_8_ != CONCAT44(bi_2._36_4_,bi_2.mask_)) {
          poVar8 = std::operator<<((ostream *)&std::cerr,"Error in line:");
          poVar8 = (ostream *)std::ostream::operator<<((ostream *)poVar8,0xaf);
          poVar8 = std::operator<<(poVar8," p==map.end()");
          std::endl<char,std::char_traits<char>>(poVar8);
          iVar1 = error_counter + 1;
          bVar7 = 100000 < error_counter;
          error_counter = iVar1;
          if (bVar7) {
            prVar11 = (runtime_error *)__cxa_allocate_exception(0x30);
            std::__cxx11::string::string
                      ((string *)&bi_2,"Error limits reached, stopping unit test",(allocator *)&ti_2
                      );
            booster::runtime_error::runtime_error(prVar11,(string *)&bi_2);
            __cxa_throw(prVar11,&booster::runtime_error::typeinfo,
                        booster::runtime_error::~runtime_error);
          }
        }
      }
      uVar14 = uVar14 + 1;
    }
    map_1.map_.index_.
    super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = (element_type *)0x0;
    map_1.map_.index_.
    super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    map_1.map_.end_._M_current = (wchar_t *)0x0;
    map_1.mask_ = 0;
    map_1._36_4_ = 0;
    map.full_select_ = true;
    uVar15 = 0;
    uVar14 = 0;
    for (_Var17._M_current = begin_local._M_current; _Var17._M_current != end._M_current;
        _Var17._M_current = _Var17._M_current + 1) {
      booster::locale::boundary::
      segment_index<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
      ::find((iterator *)&bi_2,&map,(base_iterator)_Var17._M_current);
      map_1.map_.index_.
      super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr = bi_2.map_.index_.
                super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr;
      map_1.map_.index_.
      super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount = bi_2.map_.index_.
                     super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount;
      map_1.map_.begin_._M_current._0_4_ = (int)bi_2.map_.begin_._M_current;
      map_1._36_4_ = bi_2._36_4_;
      map_1.mask_ = bi_2.mask_;
      map_1.map_.end_ = bi_2.map_.end_;
      uVar9 = (long)pos.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)pos.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start >> 2;
      if (uVar15 < uVar9) {
        uVar15 = (ulong)(((int)uVar15 + 1) -
                        (uint)(uVar14 < (uint)pos.super__Vector_base<int,_std::allocator<int>_>.
                                              _M_impl.super__Vector_impl_data._M_start[uVar15]));
      }
      test_counter = test_counter + 1;
      if (uVar15 < uVar9) {
        booster::locale::boundary::
        segment<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
        ::str((string_type *)&bi_2,
              (segment<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
               *)&map_1);
        _Var6 = std::operator==((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
                                 *)&bi_2,fchunks.
                                         super__Vector_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start + uVar15);
        std::__cxx11::wstring::~wstring((wstring *)&bi_2);
        if (!_Var6) {
          poVar8 = std::operator<<((ostream *)&std::cerr,"Error in line:");
          poVar8 = (ostream *)std::ostream::operator<<((ostream *)poVar8,0xc5);
          poVar8 = std::operator<<(poVar8," p->str()==fchunks[chunk_ptr]");
          std::endl<char,std::char_traits<char>>(poVar8);
          iVar1 = error_counter + 1;
          bVar7 = 100000 < error_counter;
          error_counter = iVar1;
          if (bVar7) {
            prVar11 = (runtime_error *)__cxa_allocate_exception(0x30);
            std::__cxx11::string::string
                      ((string *)&bi_2,"Error limits reached, stopping unit test",(allocator *)&ti_2
                      );
            booster::runtime_error::runtime_error(prVar11,(string *)&bi_2);
            __cxa_throw(prVar11,&booster::runtime_error::typeinfo,
                        booster::runtime_error::~runtime_error);
          }
        }
        test_counter = test_counter + 1;
        if ((int)map_1.map_.begin_._M_current !=
            masks.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start[uVar15]) {
          poVar8 = std::operator<<((ostream *)&std::cerr,"Error in line:");
          poVar8 = (ostream *)std::ostream::operator<<((ostream *)poVar8,0xc6);
          poVar8 = std::operator<<(poVar8," p->rule()==unsigned(masks[chunk_ptr])");
          std::endl<char,std::char_traits<char>>(poVar8);
          iVar1 = error_counter + 1;
          bVar7 = 100000 < error_counter;
          error_counter = iVar1;
          if (bVar7) {
            prVar11 = (runtime_error *)__cxa_allocate_exception(0x30);
            std::__cxx11::string::string
                      ((string *)&bi_2,"Error limits reached, stopping unit test",(allocator *)&ti_2
                      );
            booster::runtime_error::runtime_error(prVar11,(string *)&bi_2);
            __cxa_throw(prVar11,&booster::runtime_error::typeinfo,
                        booster::runtime_error::~runtime_error);
          }
        }
      }
      else {
        booster::locale::boundary::
        segment_index<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
        ::end((iterator *)&bi_2,&map);
        if (map_1._32_8_ != CONCAT44(bi_2._36_4_,bi_2.mask_)) {
          poVar8 = std::operator<<((ostream *)&std::cerr,"Error in line:");
          poVar8 = (ostream *)std::ostream::operator<<((ostream *)poVar8,0xc2);
          poVar8 = std::operator<<(poVar8," p==map.end()");
          std::endl<char,std::char_traits<char>>(poVar8);
          iVar1 = error_counter + 1;
          bVar7 = 100000 < error_counter;
          error_counter = iVar1;
          if (bVar7) {
            prVar11 = (runtime_error *)__cxa_allocate_exception(0x30);
            std::__cxx11::string::string
                      ((string *)&bi_2,"Error limits reached, stopping unit test",(allocator *)&ti_2
                      );
            booster::runtime_error::runtime_error(prVar11,(string *)&bi_2);
            __cxa_throw(prVar11,&booster::runtime_error::typeinfo,
                        booster::runtime_error::~runtime_error);
          }
        }
      }
      uVar14 = uVar14 + 1;
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&map.map_.index_.
                super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount);
    booster::locale::boundary::
    boundary_point_index<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
    ::boundary_point_index
              (&map_1,bt,(base_iterator)begin_local._M_current,(base_iterator)end._M_current,l);
    map_1.mask_ = uVar13;
    bi_2.map_.index_.
    super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = (element_type *)
              CONCAT44(map_1.map_.begin_._M_current._4_4_,(int)map_1.map_.begin_._M_current);
    bi_2.map_.index_.
    super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi =
         bi_2.map_.index_.
         super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
         ._M_refcount._M_pi & 0xffffffff00000000;
    bi_2.map_.begin_._M_current = (wchar_t *)0x0;
    uVar16 = 0;
    uVar14 = 0xffffffff;
    bi_2.map_.end_._M_current = (wchar_t *)&map_1;
    bi_2.mask_ = uVar13;
    while( true ) {
      booster::locale::boundary::
      boundary_point_index<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
      ::end((iterator *)&map,&map_1);
      test_counter = test_counter + 1;
      uVar15 = (ulong)uVar16;
      if ((bi_2.map_.end_._M_current == map.map_.end_._M_current) &&
         (bi_2.map_.begin_._M_current == map.map_.begin_._M_current)) break;
      if (bi_2.map_.index_.
          super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr !=
          (element_type *)
          iters.
          super__Vector_base<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start[uVar15]._M_current) {
        poVar8 = std::operator<<((ostream *)&std::cerr,"Error in line:");
        poVar8 = (ostream *)std::ostream::operator<<((ostream *)poVar8,0xd6);
        poVar8 = std::operator<<(poVar8," p->iterator()==iters[i]");
        std::endl<char,std::char_traits<char>>(poVar8);
        iVar1 = error_counter + 1;
        bVar7 = 100000 < error_counter;
        error_counter = iVar1;
        if (bVar7) {
          prVar11 = (runtime_error *)__cxa_allocate_exception(0x30);
          std::__cxx11::string::string
                    ((string *)&map,"Error limits reached, stopping unit test",(allocator *)&ti_2);
          booster::runtime_error::runtime_error(prVar11,(string *)&map);
          __cxa_throw(prVar11,&booster::runtime_error::typeinfo,
                      booster::runtime_error::~runtime_error);
        }
      }
      test_counter = test_counter + 1;
      if ((uint)bi_2.map_.index_.
                super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount._M_pi !=
          bmasks.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start[uVar15]) {
        poVar8 = std::operator<<((ostream *)&std::cerr,"Error in line:");
        poVar8 = (ostream *)std::ostream::operator<<((ostream *)poVar8,0xd7);
        poVar8 = std::operator<<(poVar8," p->rule()==bmasks[i]");
        std::endl<char,std::char_traits<char>>(poVar8);
        iVar1 = error_counter + 1;
        bVar7 = 100000 < error_counter;
        error_counter = iVar1;
        if (bVar7) {
          prVar11 = (runtime_error *)__cxa_allocate_exception(0x30);
          std::__cxx11::string::string
                    ((string *)&map,"Error limits reached, stopping unit test",(allocator *)&ti_2);
          booster::runtime_error::runtime_error(prVar11,(string *)&map);
          __cxa_throw(prVar11,&booster::runtime_error::typeinfo,
                      booster::runtime_error::~runtime_error);
        }
      }
      booster::locale::boundary::details::
      boundary_point_index_iterator<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
      ::increment((boundary_point_index_iterator<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                   *)&bi_2);
      uVar16 = uVar16 + 1;
      uVar14 = uVar14 + 1;
    }
    if ((long)iters.
              super__Vector_base<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish -
        (long)iters.
              super__Vector_base<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start >> 3 != uVar15) {
      poVar8 = std::operator<<((ostream *)&std::cerr,"Error in line:");
      poVar8 = (ostream *)std::ostream::operator<<((ostream *)poVar8,0xda);
      poVar8 = std::operator<<(poVar8," iters.size() == i");
      std::endl<char,std::char_traits<char>>(poVar8);
      iVar1 = error_counter + 1;
      bVar7 = 100000 < error_counter;
      error_counter = iVar1;
      if (bVar7) {
        prVar11 = (runtime_error *)__cxa_allocate_exception(0x30);
        std::__cxx11::string::string
                  ((string *)&map,"Error limits reached, stopping unit test",(allocator *)&ti_2);
        booster::runtime_error::runtime_error(prVar11,(string *)&map);
        __cxa_throw(prVar11,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error
                   );
      }
    }
    do {
      booster::locale::boundary::details::
      boundary_point_index_iterator<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
      ::decrement((boundary_point_index_iterator<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                   *)&bi_2);
      peVar3 = bi_2.map_.index_.
               super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr;
      test_counter = test_counter + 1;
      pvVar10 = std::
                vector<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>_>
                ::at(&iters,(ulong)uVar14);
      if (peVar3 != (element_type *)pvVar10->_M_current) {
        poVar8 = std::operator<<((ostream *)&std::cerr,"Error in line:");
        poVar8 = (ostream *)std::ostream::operator<<((ostream *)poVar8,0xdf);
        poVar8 = std::operator<<(poVar8," p->iterator()==iters.at(i)");
        std::endl<char,std::char_traits<char>>(poVar8);
        iVar1 = error_counter + 1;
        bVar7 = 100000 < error_counter;
        error_counter = iVar1;
        if (bVar7) {
          prVar11 = (runtime_error *)__cxa_allocate_exception(0x30);
          std::__cxx11::string::string
                    ((string *)&map,"Error limits reached, stopping unit test",(allocator *)&ti_2);
          booster::runtime_error::runtime_error(prVar11,(string *)&map);
          __cxa_throw(prVar11,&booster::runtime_error::typeinfo,
                      booster::runtime_error::~runtime_error);
        }
      }
      uVar14 = uVar14 - 1;
    } while (((boundary_point_index<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
               *)bi_2.map_.end_._M_current != &map_1) ||
            (bi_2.map_.begin_._M_current != (wchar_t *)0x0));
    test_counter = test_counter + 1;
    if (uVar14 != 0xffffffff) {
      poVar8 = std::operator<<((ostream *)&std::cerr,"Error in line:");
      poVar8 = (ostream *)std::ostream::operator<<((ostream *)poVar8,0xe1);
      poVar8 = std::operator<<(poVar8," i==0");
      std::endl<char,std::char_traits<char>>(poVar8);
      iVar1 = error_counter + 1;
      bVar7 = 100000 < error_counter;
      error_counter = iVar1;
      if (bVar7) {
        prVar11 = (runtime_error *)__cxa_allocate_exception(0x30);
        std::__cxx11::string::string
                  ((string *)&map,"Error limits reached, stopping unit test",(allocator *)&ti_2);
        booster::runtime_error::runtime_error(prVar11,(string *)&map);
        __cxa_throw(prVar11,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error
                   );
      }
    }
    uVar14 = 0;
    for (_Var17._M_current = begin_local._M_current; _Var17._M_current != end._M_current;
        _Var17._M_current = _Var17._M_current + 1) {
      booster::locale::boundary::
      boundary_point_index<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
      ::find((iterator *)&map,&map_1,(base_iterator)_Var17._M_current);
      bi_2.mask_ = map.mask_;
      bi_2.map_.begin_ = map.map_.begin_;
      bi_2.map_.end_ = map.map_.end_;
      bi_2.map_.index_.
      super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr = map.map_.index_.
                super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr;
      bi_2.map_.index_.
      super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount = map.map_.index_.
                     super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount;
      test_counter = test_counter + 1;
      if (map.map_.index_.
          super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr !=
          (element_type *)
          iters.
          super__Vector_base<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start[uVar14]._M_current) {
        poVar8 = std::operator<<((ostream *)&std::cerr,"Error in line:");
        poVar8 = (ostream *)std::ostream::operator<<((ostream *)poVar8,0xe6);
        poVar8 = std::operator<<(poVar8," p->iterator()==iters[iters_ptr]");
        std::endl<char,std::char_traits<char>>(poVar8);
        iVar1 = error_counter + 1;
        bVar7 = 100000 < error_counter;
        error_counter = iVar1;
        if (bVar7) {
          prVar11 = (runtime_error *)__cxa_allocate_exception(0x30);
          std::__cxx11::string::string
                    ((string *)&map,"Error limits reached, stopping unit test",(allocator *)&ti_2);
          booster::runtime_error::runtime_error(prVar11,(string *)&map);
          __cxa_throw(prVar11,&booster::runtime_error::typeinfo,
                      booster::runtime_error::~runtime_error);
        }
      }
      pvVar10 = std::
                vector<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>_>
                ::at(&iters,(ulong)uVar14);
      uVar14 = uVar14 + (_Var17._M_current == pvVar10->_M_current);
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&map_1.map_.index_.
                super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount);
    booster::locale::boundary::
    segment_index<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
    ::segment_index((segment_index<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                     *)&map_1,bt,(base_iterator)begin_local._M_current,(base_iterator)end._M_current
                    ,l);
    booster::locale::boundary::
    boundary_point_index<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
    ::boundary_point_index
              ((boundary_point_index<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                *)&bi_2,(segment_index<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                         *)&map_1);
    map.map_.index_.
    super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = (element_type *)bi_2.map_.begin_._M_current;
    map.map_.index_.
    super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi =
         map.map_.index_.
         super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
         ._M_refcount._M_pi & 0xffffffff00000000;
    map.map_.begin_._M_current = (wchar_t *)0x0;
    uVar14 = 0;
    bi_2.mask_ = uVar13;
    map.map_.end_._M_current = (wchar_t *)&bi_2;
    map.mask_ = uVar13;
    while ((booster::locale::boundary::
            boundary_point_index<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
            ::end((iterator *)&ti_2,
                  (boundary_point_index<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                   *)&bi_2), map.map_.end_._M_current != ti_2.map_.end_._M_current ||
           (map.map_.begin_._M_current != ti_2.map_.begin_._M_current))) {
      test_counter = test_counter + 1;
      if (map.map_.index_.
          super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr !=
          (element_type *)
          iters.
          super__Vector_base<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start[uVar14]._M_current) {
        poVar8 = std::operator<<((ostream *)&std::cerr,"Error in line:");
        poVar8 = (ostream *)std::ostream::operator<<((ostream *)poVar8,0xf9);
        poVar8 = std::operator<<(poVar8," p->iterator()==iters[i]");
        std::endl<char,std::char_traits<char>>(poVar8);
        iVar1 = error_counter + 1;
        bVar7 = 100000 < error_counter;
        error_counter = iVar1;
        if (bVar7) {
          prVar11 = (runtime_error *)__cxa_allocate_exception(0x30);
          std::__cxx11::string::string
                    ((string *)&ti_2,"Error limits reached, stopping unit test",(allocator *)&ti_3);
          booster::runtime_error::runtime_error(prVar11,(string *)&ti_2);
          __cxa_throw(prVar11,&booster::runtime_error::typeinfo,
                      booster::runtime_error::~runtime_error);
        }
      }
      test_counter = test_counter + 1;
      if ((uint)map.map_.index_.
                super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount._M_pi !=
          bmasks.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start[uVar14]) {
        poVar8 = std::operator<<((ostream *)&std::cerr,"Error in line:");
        poVar8 = (ostream *)std::ostream::operator<<((ostream *)poVar8,0xfa);
        poVar8 = std::operator<<(poVar8," p->rule()==bmasks[i]");
        std::endl<char,std::char_traits<char>>(poVar8);
        iVar1 = error_counter + 1;
        bVar7 = 100000 < error_counter;
        error_counter = iVar1;
        if (bVar7) {
          prVar11 = (runtime_error *)__cxa_allocate_exception(0x30);
          std::__cxx11::string::string
                    ((string *)&ti_2,"Error limits reached, stopping unit test",(allocator *)&ti_3);
          booster::runtime_error::runtime_error(prVar11,(string *)&ti_2);
          __cxa_throw(prVar11,&booster::runtime_error::typeinfo,
                      booster::runtime_error::~runtime_error);
        }
      }
      booster::locale::boundary::details::
      boundary_point_index_iterator<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
      ::increment((boundary_point_index_iterator<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                   *)&map);
      uVar14 = uVar14 + 1;
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&bi_2.map_.index_.
                super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount);
    bi_2.map_.begin_._M_current = (wchar_t *)0x0;
    bi_2.map_.end_._M_current = (wchar_t *)0x0;
    bi_2.map_.index_.
    super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = (element_type *)0x0;
    bi_2.map_.index_.
    super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    bi_2.mask_ = uVar13;
    booster::locale::boundary::details::
    mapping<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
    ::operator=((mapping<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                 *)&bi_2,&map_1.map_);
    map.map_.index_.
    super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = (element_type *)bi_2.map_.begin_._M_current;
    map.map_.index_.
    super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi =
         map.map_.index_.
         super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
         ._M_refcount._M_pi & 0xffffffff00000000;
    map.map_.begin_._M_current = (wchar_t *)0x0;
    map.mask_ = bi_2.mask_;
    uVar14 = 0;
    map.map_.end_._M_current = (wchar_t *)&bi_2;
    while ((booster::locale::boundary::
            boundary_point_index<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
            ::end((iterator *)&ti_2,
                  (boundary_point_index<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                   *)&bi_2), map.map_.end_._M_current != ti_2.map_.end_._M_current ||
           (map.map_.begin_._M_current != ti_2.map_.begin_._M_current))) {
      test_counter = test_counter + 1;
      if (map.map_.index_.
          super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr !=
          (element_type *)
          iters.
          super__Vector_base<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start[uVar14]._M_current) {
        poVar8 = std::operator<<((ostream *)&std::cerr,"Error in line:");
        poVar8 = (ostream *)std::ostream::operator<<((ostream *)poVar8,0x104);
        poVar8 = std::operator<<(poVar8," p->iterator()==iters[i]");
        std::endl<char,std::char_traits<char>>(poVar8);
        iVar1 = error_counter + 1;
        bVar7 = 100000 < error_counter;
        error_counter = iVar1;
        if (bVar7) {
          prVar11 = (runtime_error *)__cxa_allocate_exception(0x30);
          std::__cxx11::string::string
                    ((string *)&ti_2,"Error limits reached, stopping unit test",(allocator *)&ti_3);
          booster::runtime_error::runtime_error(prVar11,(string *)&ti_2);
          __cxa_throw(prVar11,&booster::runtime_error::typeinfo,
                      booster::runtime_error::~runtime_error);
        }
      }
      test_counter = test_counter + 1;
      if ((uint)map.map_.index_.
                super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount._M_pi !=
          bmasks.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start[uVar14]) {
        poVar8 = std::operator<<((ostream *)&std::cerr,"Error in line:");
        poVar8 = (ostream *)std::ostream::operator<<((ostream *)poVar8,0x105);
        poVar8 = std::operator<<(poVar8," p->rule()==bmasks[i]");
        std::endl<char,std::char_traits<char>>(poVar8);
        iVar1 = error_counter + 1;
        bVar7 = 100000 < error_counter;
        error_counter = iVar1;
        if (bVar7) {
          prVar11 = (runtime_error *)__cxa_allocate_exception(0x30);
          std::__cxx11::string::string
                    ((string *)&ti_2,"Error limits reached, stopping unit test",(allocator *)&ti_3);
          booster::runtime_error::runtime_error(prVar11,(string *)&ti_2);
          __cxa_throw(prVar11,&booster::runtime_error::typeinfo,
                      booster::runtime_error::~runtime_error);
        }
      }
      booster::locale::boundary::details::
      boundary_point_index_iterator<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
      ::increment((boundary_point_index_iterator<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                   *)&map);
      uVar14 = uVar14 + 1;
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&bi_2.map_.index_.
                super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount);
    booster::locale::boundary::
    boundary_point_index<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
    ::boundary_point_index
              ((boundary_point_index<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                *)&bi_2,bt,(base_iterator)begin_local._M_current,(base_iterator)end._M_current,l);
    bi_2.mask_ = uVar13;
    booster::locale::boundary::
    boundary_point_index<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
    ::boundary_point_index
              ((boundary_point_index<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                *)&map,(boundary_point_index<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                        *)&bi_2);
    ti_2.map_.index_.
    super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = (element_type *)map.map_.begin_._M_current;
    ti_2.map_.index_.
    super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi =
         ti_2.map_.index_.
         super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
         ._M_refcount._M_pi & 0xffffffff00000000;
    ti_2.map_.begin_._M_current = (wchar_t *)0x0;
    ti_2.mask_ = map.mask_;
    uVar14 = 0;
    ti_2.map_.end_._M_current = (wchar_t *)&map;
    while ((booster::locale::boundary::
            boundary_point_index<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
            ::end((iterator *)&ti_3,
                  (boundary_point_index<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                   *)&map), ti_2.map_.end_._M_current != ti_3.map_.end_._M_current ||
           (ti_2.map_.begin_._M_current != ti_3.map_.begin_._M_current))) {
      test_counter = test_counter + 1;
      if (ti_2.map_.index_.
          super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr !=
          (element_type *)
          iters.
          super__Vector_base<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start[uVar14]._M_current) {
        poVar8 = std::operator<<((ostream *)&std::cerr,"Error in line:");
        poVar8 = (ostream *)std::ostream::operator<<((ostream *)poVar8,0x110);
        poVar8 = std::operator<<(poVar8," p->iterator()==iters[i]");
        std::endl<char,std::char_traits<char>>(poVar8);
        iVar1 = error_counter + 1;
        bVar7 = 100000 < error_counter;
        error_counter = iVar1;
        if (bVar7) {
          prVar11 = (runtime_error *)__cxa_allocate_exception(0x30);
          std::__cxx11::string::string
                    ((string *)&ti_3,"Error limits reached, stopping unit test",&local_259);
          booster::runtime_error::runtime_error(prVar11,(string *)&ti_3);
          __cxa_throw(prVar11,&booster::runtime_error::typeinfo,
                      booster::runtime_error::~runtime_error);
        }
      }
      test_counter = test_counter + 1;
      if ((uint)ti_2.map_.index_.
                super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount._M_pi !=
          bmasks.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start[uVar14]) {
        poVar8 = std::operator<<((ostream *)&std::cerr,"Error in line:");
        poVar8 = (ostream *)std::ostream::operator<<((ostream *)poVar8,0x111);
        poVar8 = std::operator<<(poVar8," p->rule()==bmasks[i]");
        std::endl<char,std::char_traits<char>>(poVar8);
        iVar1 = error_counter + 1;
        bVar7 = 100000 < error_counter;
        error_counter = iVar1;
        if (bVar7) {
          prVar11 = (runtime_error *)__cxa_allocate_exception(0x30);
          std::__cxx11::string::string
                    ((string *)&ti_3,"Error limits reached, stopping unit test",&local_259);
          booster::runtime_error::runtime_error(prVar11,(string *)&ti_3);
          __cxa_throw(prVar11,&booster::runtime_error::typeinfo,
                      booster::runtime_error::~runtime_error);
        }
      }
      booster::locale::boundary::details::
      boundary_point_index_iterator<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
      ::increment((boundary_point_index_iterator<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                   *)&ti_2);
      uVar14 = uVar14 + 1;
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&map.map_.index_.
                super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount);
    map.map_.begin_._M_current = (wchar_t *)0x0;
    map.map_.end_._M_current = (wchar_t *)0x0;
    map.map_.index_.
    super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = (element_type *)0x0;
    map.map_.index_.
    super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    map.mask_ = 0xffffffff;
    booster::locale::boundary::
    boundary_point_index<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
    ::operator=((boundary_point_index<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                 *)&map,(boundary_point_index<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                         *)&bi_2);
    ti_2.map_.index_.
    super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = (element_type *)map.map_.begin_._M_current;
    ti_2.map_.index_.
    super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi =
         ti_2.map_.index_.
         super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
         ._M_refcount._M_pi & 0xffffffff00000000;
    ti_2.map_.begin_._M_current = (wchar_t *)0x0;
    ti_2.mask_ = map.mask_;
    uVar14 = 0;
    ti_2.map_.end_._M_current = (wchar_t *)&map;
    while ((booster::locale::boundary::
            boundary_point_index<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
            ::end((iterator *)&ti_3,
                  (boundary_point_index<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                   *)&map), ti_2.map_.end_._M_current != ti_3.map_.end_._M_current ||
           (ti_2.map_.begin_._M_current != ti_3.map_.begin_._M_current))) {
      test_counter = test_counter + 1;
      if (ti_2.map_.index_.
          super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr !=
          (element_type *)
          iters.
          super__Vector_base<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start[uVar14]._M_current) {
        poVar8 = std::operator<<((ostream *)&std::cerr,"Error in line:");
        poVar8 = (ostream *)std::ostream::operator<<((ostream *)poVar8,0x11a);
        poVar8 = std::operator<<(poVar8," p->iterator()==iters[i]");
        std::endl<char,std::char_traits<char>>(poVar8);
        iVar1 = error_counter + 1;
        bVar7 = 100000 < error_counter;
        error_counter = iVar1;
        if (bVar7) {
          prVar11 = (runtime_error *)__cxa_allocate_exception(0x30);
          std::__cxx11::string::string
                    ((string *)&ti_3,"Error limits reached, stopping unit test",&local_259);
          booster::runtime_error::runtime_error(prVar11,(string *)&ti_3);
          __cxa_throw(prVar11,&booster::runtime_error::typeinfo,
                      booster::runtime_error::~runtime_error);
        }
      }
      test_counter = test_counter + 1;
      if ((uint)ti_2.map_.index_.
                super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount._M_pi !=
          bmasks.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start[uVar14]) {
        poVar8 = std::operator<<((ostream *)&std::cerr,"Error in line:");
        poVar8 = (ostream *)std::ostream::operator<<((ostream *)poVar8,0x11b);
        poVar8 = std::operator<<(poVar8," p->rule()==bmasks[i]");
        std::endl<char,std::char_traits<char>>(poVar8);
        iVar1 = error_counter + 1;
        bVar7 = 100000 < error_counter;
        error_counter = iVar1;
        if (bVar7) {
          prVar11 = (runtime_error *)__cxa_allocate_exception(0x30);
          std::__cxx11::string::string
                    ((string *)&ti_3,"Error limits reached, stopping unit test",&local_259);
          booster::runtime_error::runtime_error(prVar11,(string *)&ti_3);
          __cxa_throw(prVar11,&booster::runtime_error::typeinfo,
                      booster::runtime_error::~runtime_error);
        }
      }
      booster::locale::boundary::details::
      boundary_point_index_iterator<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
      ::increment((boundary_point_index_iterator<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                   *)&ti_2);
      uVar14 = uVar14 + 1;
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&map.map_.index_.
                super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&bi_2.map_.index_.
                super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&map_1.map_.index_.
                super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount);
    booster::locale::boundary::
    boundary_point_index<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
    ::boundary_point_index
              ((boundary_point_index<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                *)&map,bt,(base_iterator)begin_local._M_current,(base_iterator)end._M_current,l);
    booster::locale::boundary::
    segment_index<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
    ::segment_index(&ti_2,(boundary_point_index<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                           *)&map);
    map_1.map_.index_.
    super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = (element_type *)0x0;
    map_1.map_.index_.
    super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    map_1.map_.end_._M_current = (wchar_t *)0x0;
    map_1.mask_ = 0;
    map_1._36_4_ = 0;
    ti_2.mask_ = uVar13;
    booster::locale::boundary::
    segment_index<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
    ::begin((iterator *)&bi_2,&ti_2);
    map_1.map_.index_.
    super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = bi_2.map_.index_.
              super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr;
    map_1.map_.index_.
    super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount = bi_2.map_.index_.
                   super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount;
    map_1.map_.begin_._M_current._0_4_ = (int)bi_2.map_.begin_._M_current;
    map_1._36_4_ = bi_2._36_4_;
    map_1.mask_ = bi_2.mask_;
    map_1.map_.end_ = bi_2.map_.end_;
    uVar14 = 0;
    while (booster::locale::boundary::
           segment_index<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
           ::end((iterator *)&bi_2,&ti_2), map_1._32_8_ != CONCAT44(bi_2._36_4_,bi_2.mask_)) {
      test_counter = test_counter + 1;
      booster::locale::boundary::
      segment<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
      ::str((string_type *)&bi_2,
            (segment<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
             *)&map_1);
      _Var6 = std::operator==((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
                               *)&bi_2,chunks.
                                       super__Vector_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start + uVar14);
      std::__cxx11::wstring::~wstring((wstring *)&bi_2);
      if (!_Var6) {
        poVar8 = std::operator<<((ostream *)&std::cerr,"Error in line:");
        poVar8 = (ostream *)std::ostream::operator<<((ostream *)poVar8,0x127);
        poVar8 = std::operator<<(poVar8," p->str()==chunks[i]");
        std::endl<char,std::char_traits<char>>(poVar8);
        iVar1 = error_counter + 1;
        bVar7 = 100000 < error_counter;
        error_counter = iVar1;
        if (bVar7) {
          prVar11 = (runtime_error *)__cxa_allocate_exception(0x30);
          std::__cxx11::string::string
                    ((string *)&bi_2,"Error limits reached, stopping unit test",(allocator *)&ti_3);
          booster::runtime_error::runtime_error(prVar11,(string *)&bi_2);
          __cxa_throw(prVar11,&booster::runtime_error::typeinfo,
                      booster::runtime_error::~runtime_error);
        }
      }
      test_counter = test_counter + 1;
      if ((int)map_1.map_.begin_._M_current !=
          masks.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start[uVar14]) {
        poVar8 = std::operator<<((ostream *)&std::cerr,"Error in line:");
        poVar8 = (ostream *)std::ostream::operator<<((ostream *)poVar8,0x128);
        poVar8 = std::operator<<(poVar8," p->rule()==unsigned(masks[i])");
        std::endl<char,std::char_traits<char>>(poVar8);
        iVar1 = error_counter + 1;
        bVar7 = 100000 < error_counter;
        error_counter = iVar1;
        if (bVar7) {
          prVar11 = (runtime_error *)__cxa_allocate_exception(0x30);
          std::__cxx11::string::string
                    ((string *)&bi_2,"Error limits reached, stopping unit test",(allocator *)&ti_3);
          booster::runtime_error::runtime_error(prVar11,(string *)&bi_2);
          __cxa_throw(prVar11,&booster::runtime_error::typeinfo,
                      booster::runtime_error::~runtime_error);
        }
      }
      booster::locale::boundary::details::
      segment_index_iterator<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
      ::increment((segment_index_iterator<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                   *)&map_1);
      uVar14 = uVar14 + 1;
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&ti_2.map_.index_.
                super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount);
    ti_2.map_.begin_._M_current = (wchar_t *)0x0;
    ti_2.map_.end_._M_current = (wchar_t *)0x0;
    ti_2.map_.index_.
    super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = (element_type *)0x0;
    ti_2.map_.index_.
    super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    ti_2.full_select_ = false;
    ti_2.mask_ = uVar13;
    booster::locale::boundary::details::
    mapping<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
    ::operator=(&ti_2.map_,&map.map_);
    map_1.map_.index_.
    super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = (element_type *)0x0;
    map_1.map_.index_.
    super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    map_1.map_.end_._M_current = (wchar_t *)0x0;
    map_1.mask_ = 0;
    map_1._36_4_ = 0;
    booster::locale::boundary::
    segment_index<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
    ::begin((iterator *)&bi_2,&ti_2);
    map_1.map_.index_.
    super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = bi_2.map_.index_.
              super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr;
    map_1.map_.index_.
    super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount = bi_2.map_.index_.
                   super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount;
    map_1.map_.begin_._M_current._0_4_ = (int)bi_2.map_.begin_._M_current;
    map_1._36_4_ = bi_2._36_4_;
    map_1.mask_ = bi_2.mask_;
    map_1.map_.end_ = bi_2.map_.end_;
    uVar14 = 0;
    while (booster::locale::boundary::
           segment_index<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
           ::end((iterator *)&bi_2,&ti_2), map_1._32_8_ != CONCAT44(bi_2._36_4_,bi_2.mask_)) {
      test_counter = test_counter + 1;
      booster::locale::boundary::
      segment<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
      ::str((string_type *)&bi_2,
            (segment<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
             *)&map_1);
      _Var6 = std::operator==((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
                               *)&bi_2,chunks.
                                       super__Vector_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start + uVar14);
      std::__cxx11::wstring::~wstring((wstring *)&bi_2);
      if (!_Var6) {
        poVar8 = std::operator<<((ostream *)&std::cerr,"Error in line:");
        poVar8 = (ostream *)std::ostream::operator<<((ostream *)poVar8,0x132);
        poVar8 = std::operator<<(poVar8," p->str()==chunks[i]");
        std::endl<char,std::char_traits<char>>(poVar8);
        iVar1 = error_counter + 1;
        bVar7 = 100000 < error_counter;
        error_counter = iVar1;
        if (bVar7) {
          prVar11 = (runtime_error *)__cxa_allocate_exception(0x30);
          std::__cxx11::string::string
                    ((string *)&bi_2,"Error limits reached, stopping unit test",(allocator *)&ti_3);
          booster::runtime_error::runtime_error(prVar11,(string *)&bi_2);
          __cxa_throw(prVar11,&booster::runtime_error::typeinfo,
                      booster::runtime_error::~runtime_error);
        }
      }
      test_counter = test_counter + 1;
      if ((int)map_1.map_.begin_._M_current !=
          masks.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start[uVar14]) {
        poVar8 = std::operator<<((ostream *)&std::cerr,"Error in line:");
        poVar8 = (ostream *)std::ostream::operator<<((ostream *)poVar8,0x133);
        poVar8 = std::operator<<(poVar8," p->rule()==unsigned(masks[i])");
        std::endl<char,std::char_traits<char>>(poVar8);
        iVar1 = error_counter + 1;
        bVar7 = 100000 < error_counter;
        error_counter = iVar1;
        if (bVar7) {
          prVar11 = (runtime_error *)__cxa_allocate_exception(0x30);
          std::__cxx11::string::string
                    ((string *)&bi_2,"Error limits reached, stopping unit test",(allocator *)&ti_3);
          booster::runtime_error::runtime_error(prVar11,(string *)&bi_2);
          __cxa_throw(prVar11,&booster::runtime_error::typeinfo,
                      booster::runtime_error::~runtime_error);
        }
      }
      booster::locale::boundary::details::
      segment_index_iterator<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
      ::increment((segment_index_iterator<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                   *)&map_1);
      uVar14 = uVar14 + 1;
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&ti_2.map_.index_.
                super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount);
    booster::locale::boundary::
    segment_index<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
    ::segment_index(&ti_2,bt,(base_iterator)begin_local._M_current,(base_iterator)end._M_current,l);
    ti_2.mask_ = uVar13;
    booster::locale::boundary::
    segment_index<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
    ::segment_index(&ti_3,&ti_2);
    map_1.map_.index_.
    super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = (element_type *)0x0;
    map_1.map_.index_.
    super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    map_1.map_.end_._M_current = (wchar_t *)0x0;
    map_1.mask_ = 0;
    map_1._36_4_ = 0;
    booster::locale::boundary::
    segment_index<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
    ::begin((iterator *)&bi_2,&ti_3);
    map_1.map_.index_.
    super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = bi_2.map_.index_.
              super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr;
    map_1.map_.index_.
    super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount = bi_2.map_.index_.
                   super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount;
    map_1.map_.begin_._M_current._0_4_ = (int)bi_2.map_.begin_._M_current;
    map_1._36_4_ = bi_2._36_4_;
    map_1.mask_ = bi_2.mask_;
    map_1.map_.end_ = bi_2.map_.end_;
    uVar13 = 0;
    while (booster::locale::boundary::
           segment_index<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
           ::end((iterator *)&bi_2,&ti_3), map_1._32_8_ != CONCAT44(bi_2._36_4_,bi_2.mask_)) {
      test_counter = test_counter + 1;
      booster::locale::boundary::
      segment<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
      ::str((string_type *)&bi_2,
            (segment<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
             *)&map_1);
      _Var6 = std::operator==((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
                               *)&bi_2,chunks.
                                       super__Vector_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start + uVar13);
      std::__cxx11::wstring::~wstring((wstring *)&bi_2);
      if (!_Var6) {
        poVar8 = std::operator<<((ostream *)&std::cerr,"Error in line:");
        poVar8 = (ostream *)std::ostream::operator<<((ostream *)poVar8,0x13d);
        poVar8 = std::operator<<(poVar8," p->str()==chunks[i]");
        std::endl<char,std::char_traits<char>>(poVar8);
        iVar1 = error_counter + 1;
        bVar7 = 100000 < error_counter;
        error_counter = iVar1;
        if (bVar7) {
          prVar11 = (runtime_error *)__cxa_allocate_exception(0x30);
          std::__cxx11::string::string
                    ((string *)&bi_2,"Error limits reached, stopping unit test",&local_259);
          booster::runtime_error::runtime_error(prVar11,(string *)&bi_2);
          __cxa_throw(prVar11,&booster::runtime_error::typeinfo,
                      booster::runtime_error::~runtime_error);
        }
      }
      test_counter = test_counter + 1;
      if ((int)map_1.map_.begin_._M_current !=
          masks.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start[uVar13]) {
        poVar8 = std::operator<<((ostream *)&std::cerr,"Error in line:");
        poVar8 = (ostream *)std::ostream::operator<<((ostream *)poVar8,0x13e);
        poVar8 = std::operator<<(poVar8," p->rule()==unsigned(masks[i])");
        std::endl<char,std::char_traits<char>>(poVar8);
        iVar1 = error_counter + 1;
        bVar7 = 100000 < error_counter;
        error_counter = iVar1;
        if (bVar7) {
          prVar11 = (runtime_error *)__cxa_allocate_exception(0x30);
          std::__cxx11::string::string
                    ((string *)&bi_2,"Error limits reached, stopping unit test",&local_259);
          booster::runtime_error::runtime_error(prVar11,(string *)&bi_2);
          __cxa_throw(prVar11,&booster::runtime_error::typeinfo,
                      booster::runtime_error::~runtime_error);
        }
      }
      booster::locale::boundary::details::
      segment_index_iterator<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
      ::increment((segment_index_iterator<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                   *)&map_1);
      uVar13 = uVar13 + 1;
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&ti_3.map_.index_.
                super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount);
    ti_3.map_.begin_._M_current = (wchar_t *)0x0;
    ti_3.map_.end_._M_current = (wchar_t *)0x0;
    ti_3.map_.index_.
    super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = (element_type *)0x0;
    ti_3.map_.index_.
    super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    ti_3.mask_ = 0xffffffff;
    ti_3.full_select_ = false;
    booster::locale::boundary::
    segment_index<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
    ::operator=(&ti_3,&ti_2);
    map_1.map_.index_.
    super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = (element_type *)0x0;
    map_1.map_.index_.
    super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    map_1.map_.end_._M_current = (wchar_t *)0x0;
    map_1.mask_ = 0;
    map_1._36_4_ = 0;
    booster::locale::boundary::
    segment_index<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
    ::begin((iterator *)&bi_2,&ti_3);
    map_1.map_.index_.
    super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = bi_2.map_.index_.
              super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr;
    map_1.map_.index_.
    super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount = bi_2.map_.index_.
                   super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount;
    map_1.map_.begin_._M_current._0_4_ = (int)bi_2.map_.begin_._M_current;
    map_1._36_4_ = bi_2._36_4_;
    map_1.mask_ = bi_2.mask_;
    map_1.map_.end_ = bi_2.map_.end_;
    uVar13 = 0;
    while (booster::locale::boundary::
           segment_index<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
           ::end((iterator *)&bi_2,&ti_3), map_1._32_8_ != CONCAT44(bi_2._36_4_,bi_2.mask_)) {
      test_counter = test_counter + 1;
      booster::locale::boundary::
      segment<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
      ::str((string_type *)&bi_2,
            (segment<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
             *)&map_1);
      _Var6 = std::operator==((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
                               *)&bi_2,chunks.
                                       super__Vector_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start + uVar13);
      std::__cxx11::wstring::~wstring((wstring *)&bi_2);
      if (!_Var6) {
        poVar8 = std::operator<<((ostream *)&std::cerr,"Error in line:");
        poVar8 = (ostream *)std::ostream::operator<<((ostream *)poVar8,0x147);
        poVar8 = std::operator<<(poVar8," p->str()==chunks[i]");
        std::endl<char,std::char_traits<char>>(poVar8);
        iVar1 = error_counter + 1;
        bVar7 = 100000 < error_counter;
        error_counter = iVar1;
        if (bVar7) {
          prVar11 = (runtime_error *)__cxa_allocate_exception(0x30);
          std::__cxx11::string::string
                    ((string *)&bi_2,"Error limits reached, stopping unit test",&local_259);
          booster::runtime_error::runtime_error(prVar11,(string *)&bi_2);
          __cxa_throw(prVar11,&booster::runtime_error::typeinfo,
                      booster::runtime_error::~runtime_error);
        }
      }
      test_counter = test_counter + 1;
      if ((int)map_1.map_.begin_._M_current !=
          masks.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start[uVar13]) {
        poVar8 = std::operator<<((ostream *)&std::cerr,"Error in line:");
        poVar8 = (ostream *)std::ostream::operator<<((ostream *)poVar8,0x148);
        poVar8 = std::operator<<(poVar8," p->rule()==unsigned(masks[i])");
        std::endl<char,std::char_traits<char>>(poVar8);
        iVar1 = error_counter + 1;
        bVar7 = 100000 < error_counter;
        error_counter = iVar1;
        if (bVar7) {
          prVar11 = (runtime_error *)__cxa_allocate_exception(0x30);
          std::__cxx11::string::string
                    ((string *)&bi_2,"Error limits reached, stopping unit test",&local_259);
          booster::runtime_error::runtime_error(prVar11,(string *)&bi_2);
          __cxa_throw(prVar11,&booster::runtime_error::typeinfo,
                      booster::runtime_error::~runtime_error);
        }
      }
      booster::locale::boundary::details::
      segment_index_iterator<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
      ::increment((segment_index_iterator<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                   *)&map_1);
      uVar13 = uVar13 + 1;
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&ti_3.map_.index_.
                super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&ti_2.map_.index_.
                super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&map.map_.index_.
                super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount);
    std::
    _Vector_base<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>_>
    ::~_Vector_base(&iters.
                     super__Vector_base<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>_>
                   );
    std::
    vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
    ::~vector(&fchunks);
    std::
    vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
    ::~vector(&chunks);
    std::__cxx11::wstring::~wstring((wstring *)&empty_chunk);
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
              (&bmasks.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              (&pos.super__Vector_base<int,_std::allocator<int>_>);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              (&masks.super__Vector_base<int,_std::allocator<int>_>);
    uVar12 = uVar12 - 1;
  } while( true );
}

Assistant:

void test_word_container(Iterator begin,Iterator end,
    std::vector<int> const &ipos,
    std::vector<int> const &imasks,
    std::vector<std::basic_string<Char> > const &ichunks,
    std::locale l,
    lb::boundary_type bt=lb::word
    )
{
    for(int sm=(bt == lb::word ? 31 : 3 ) ;sm>=0;sm--) {
        unsigned mask = 
              ((sm & 1 ) != 0) * 0xF
            + ((sm & 2 ) != 0) * 0xF0
            + ((sm & 4 ) != 0) * 0xF00
            + ((sm & 8 ) != 0) * 0xF000
            + ((sm & 16) != 0) * 0xF0000;

        std::vector<int> masks,pos;
        std::vector<unsigned> bmasks;
        std::basic_string<Char> empty_chunk;

        std::vector<std::basic_string<Char> > chunks;
        std::vector<std::basic_string<Char> > fchunks;
        std::vector<Iterator> iters;
        iters.push_back(begin);
        bmasks.push_back(0);

        for(unsigned i=0;i<imasks.size();i++) {
            if(imasks[i] & mask) {
                masks.push_back(imasks[i]);
                chunks.push_back(ichunks[i]);
                fchunks.push_back(empty_chunk + ichunks[i]);
                empty_chunk.clear();
                pos.push_back(ipos[i]);
            }
            else {
                empty_chunk+=ichunks[i];
            }

            if((imasks[i] & mask) || i==imasks.size()-1){
                Iterator ptr=begin;
                std::advance(ptr,ipos[i]);
                iters.push_back(ptr);
                bmasks.push_back(imasks[i]);
            }
        }

        //
        // segment iterator tests
        //
        {
            lb::segment_index<Iterator> map(bt,begin,end,l);
            typedef typename lb::segment_index<Iterator>::iterator iter_type;

            map.rule(mask);

            {        
                unsigned i=0;
                iter_type p;
                map.full_select(false);
                for(p=map.begin();p!=map.end();++p,i++) {
                    TEST(p->str()==chunks[i]);
                    TEST(p->rule() == unsigned(masks[i]));
                }
                
                TEST(chunks.size() == i);
                for(;;) {
                    if(p==map.begin()) {
                        TEST(i==0);
                        break;
                    }
                    else {
                        --p;
                        TEST(p->str()==chunks[--i]);
                        TEST(p->rule() == unsigned(masks[i]));
                    }
                }
                for(i=0,p=map.end();i<chunks.size();i++){
                    --p;
                    unsigned index = chunks.size() - i - 1;
                    TEST(p->str()==chunks[index]);
                    TEST(p->rule() == unsigned(masks[index]));
                }
                TEST(p==map.begin());
            }

            {
                unsigned i=0;
                iter_type p;
                map.full_select(true);
                for(p=map.begin();p!=map.end();++p,i++) {
                    TEST(p->str()==fchunks[i]);
                    TEST(p->rule() == unsigned(masks[i]));
                }

                TEST(chunks.size() == i);
                
                for(;;) {
                    if(p==map.begin()) {
                        TEST(i==0);
                        break;
                    }
                    else {
                        --p;
                        if(p->str()!=fchunks[i-1]) {
                            print_str(p->str());
                            print_str(fchunks[i-1]);
                        }
                        TEST(p->str()==fchunks[--i]);
                        TEST(p->rule() == unsigned(masks[i]));
                    }
                }
                
                for(i=0,p=map.end();i<chunks.size();i++){
                    --p;
                    unsigned index = chunks.size() - i - 1;
                    TEST(p->str()==fchunks[index]);
                    TEST(p->rule() == unsigned(masks[index]));
                }
                TEST(p==map.begin());
            }
            
            {            
                iter_type p;
                unsigned chunk_ptr=0;
                unsigned i=0;
                map.full_select(false);
                for(Iterator optr=begin;optr!=end;optr++,i++) {
                    p=map.find(optr);
                    if(chunk_ptr < pos.size() && i>=unsigned(pos[chunk_ptr])){
                        chunk_ptr++;
                    }
                    if(chunk_ptr>=pos.size()) {
                        TEST(p==map.end());
                    }
                    else {
                        TEST(p->str()==chunks[chunk_ptr]);
                        TEST(p->rule()==unsigned(masks[chunk_ptr]));
                    }
                }
            }
            {            
                iter_type p;
                unsigned chunk_ptr=0;
                unsigned i=0;
                map.full_select(true);
                for(Iterator optr=begin;optr!=end;optr++,i++) {
                    p=map.find(optr);
                    if(chunk_ptr < pos.size() && i>=unsigned(pos[chunk_ptr])){
                        chunk_ptr++;
                    }
                    if(chunk_ptr>=pos.size()) {
                        TEST(p==map.end());
                    }
                    else {
                        TEST(p->str()==fchunks[chunk_ptr]);
                        TEST(p->rule()==unsigned(masks[chunk_ptr]));
                    }
                }
            }

        } // segment iterator tests

        { // break iterator tests
            lb::boundary_point_index<Iterator> map(bt,begin,end,l);
            typedef typename lb::boundary_point_index<Iterator>::iterator iter_type;

            map.rule(mask);
        
            unsigned i=0;
            iter_type p;
            for(p=map.begin();p!=map.end();++p,i++) {
                TEST(p->iterator()==iters[i]);
                TEST(p->rule()==bmasks[i]);
            }

            TEST(iters.size() == i);

            do {
                --p;
                --i;
                TEST(p->iterator()==iters.at(i));
            } while(p!=map.begin());
            TEST(i==0);

            unsigned iters_ptr=0;
            for(Iterator optr=begin;optr!=end;optr++) {
                p=map.find(optr);
                TEST(p->iterator()==iters[iters_ptr]);
                if(iters.at(iters_ptr)==optr)
                    iters_ptr++;
            }
        
        } // break iterator tests

        { // copy test
            typedef lb::segment_index<Iterator> ti_type;
            typedef lb::boundary_point_index<Iterator> bi_type;
            {   // segment to bound
                ti_type ti(bt,begin,end,l);
                ti.rule(mask);
                {
                    bi_type bi(ti);
                    bi.rule(mask);
                    unsigned i=0;
                    typename bi_type::iterator p;
                    for(p=bi.begin();p!=bi.end();++p,i++) {
                        TEST(p->iterator()==iters[i]);
                        TEST(p->rule()==bmasks[i]);
                    }
                }
                {
                    bi_type bi;
                    bi.rule(mask);
                    bi = ti;
                    unsigned i=0;
                    typename bi_type::iterator p;
                    for(p=bi.begin();p!=bi.end();++p,i++) {
                        TEST(p->iterator()==iters[i]);
                        TEST(p->rule()==bmasks[i]);
                    }
                }
                // boundary_point to bound
                bi_type bi_2(bt,begin,end,l);
                bi_2.rule(mask);
                {
                    bi_type bi(bi_2);
                    unsigned i=0;
                    typename bi_type::iterator p;
                    for(p=bi.begin();p!=bi.end();++p,i++) {
                        TEST(p->iterator()==iters[i]);
                        TEST(p->rule()==bmasks[i]);
                    }
                }
                {
                    bi_type bi;
                    bi = bi_2;
                    unsigned i=0;
                    typename bi_type::iterator p;
                    for(p=bi.begin();p!=bi.end();++p,i++) {
                        TEST(p->iterator()==iters[i]);
                        TEST(p->rule()==bmasks[i]);
                    }
                }
            }
            {   // boundary_point to segment
                bi_type bi(bt,begin,end,l);
                {
                    ti_type ti(bi);
                    ti.rule(mask);
                    unsigned i=0;
                    typename ti_type::iterator p;
                    for(p=ti.begin();p!=ti.end();++p,i++) {
                        TEST(p->str()==chunks[i]);
                        TEST(p->rule()==unsigned(masks[i]));
                    }
                }
                {
                    ti_type ti;
                    ti.rule(mask);
                    ti = (bi);
                    unsigned i=0;
                    typename ti_type::iterator p;
                    for(p=ti.begin();p!=ti.end();++p,i++) {
                        TEST(p->str()==chunks[i]);
                        TEST(p->rule()==unsigned(masks[i]));
                    }
                }
                ti_type ti_2(bt,begin,end,l);
                ti_2.rule(mask);
                {
                    ti_type ti(ti_2);
                    unsigned i=0;
                    typename ti_type::iterator p;
                    for(p=ti.begin();p!=ti.end();++p,i++) {
                        TEST(p->str()==chunks[i]);
                        TEST(p->rule()==unsigned(masks[i]));
                    }
                }
                {
                    ti_type ti;
                    ti = (ti_2);
                    unsigned i=0;
                    typename ti_type::iterator p;
                    for(p=ti.begin();p!=ti.end();++p,i++) {
                        TEST(p->str()==chunks[i]);
                        TEST(p->rule()==unsigned(masks[i]));
                    }
                }
            }
        }
    } // for mask

}